

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

IVal * vkt::shaderexecutor::ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::
       doRound(IVal *__return_storage_ptr__,FloatFormat *fmt,Vector<float,_4> *value)

{
  bool *pbVar1;
  long lVar2;
  IVal local_40;
  
  tcu::Vector<tcu::Interval,_4>::Vector(__return_storage_ptr__);
  for (lVar2 = 0; lVar2 != 0x18; lVar2 = lVar2 + 6) {
    round<float>(&local_40,fmt,value->m_data);
    *(double *)((long)&__return_storage_ptr__->m_data[0].m_hi + lVar2 * 4) = local_40.m_hi;
    pbVar1 = &__return_storage_ptr__->m_data[0].m_hasNaN + lVar2 * 4;
    *(undefined8 *)pbVar1 = local_40._0_8_;
    *(double *)(pbVar1 + 8) = local_40.m_lo;
    value = (Vector<float,_4> *)((long)value + 4);
  }
  return __return_storage_ptr__;
}

Assistant:

static IVal			doRound			(const FloatFormat& fmt, T value)
	{
		IVal ret;

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
			ret[ndx] = round(fmt, value[ndx]);

		return ret;
	}